

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O3

void __thiscall FormatTest_UdlTemplate_Test::TestBody(FormatTest_UdlTemplate_Test *this)

{
  AssertHelperData *pAVar1;
  bool bVar2;
  char *pcVar3;
  format_string_checker<wchar_t,_fmt::v5::internal::error_handler,_int> *handler;
  char *message;
  basic_string_view<char> format_str;
  basic_string_view<char> format_str_00;
  basic_string_view<wchar_t> format_str_01;
  basic_string_view<wchar_t> format_str_02;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
  args_00;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_2;
  undefined1 local_868 [32];
  AssertHelper local_848 [3];
  udl_formatter<char,(char)123,(char)48,(char)58,(char)49,(char)48,(char)125> local_830 [8];
  undefined8 *local_828;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_820;
  code *local_800 [250];
  
  fmt::v5::internal::udl_formatter<char,_'f',_'o',_'o'>::operator()<>
            (&local_820,(udl_formatter<char,__f_,__o_,__o_> *)local_848);
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)local_868,"\"foo\"","\"foo\"_format()",(char (*) [4])0x243187,&local_820);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_820._M_dataplus._M_p != &local_820.field_2) {
    operator_delete(local_820._M_dataplus._M_p);
  }
  if (local_868[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_820);
    if ((undefined8 *)local_868._8_8_ == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_868._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_848,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x771,pcVar3);
    testing::internal::AssertHelper::operator=(local_848,(Message *)&local_820);
    testing::internal::AssertHelper::~AssertHelper(local_848);
    if ((long *)local_820._M_dataplus._M_p != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_820._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_820._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_868 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_848[0].data_._0_4_ = 0x2a;
  fmt::v5::internal::udl_formatter<char,(char)123,(char)48,(char)58,(char)49,(char)48,(char)125>::
  operator()(&local_820,local_830,(int *)local_848);
  pcVar3 = "        42";
  testing::internal::CmpHelperEQ<char[11],std::__cxx11::string>
            ((internal *)local_868,"\"        42\"","\"{0:10}\"_format(42)",
             (char (*) [11])"        42",&local_820);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_820._M_dataplus._M_p != &local_820.field_2) {
    operator_delete(local_820._M_dataplus._M_p);
  }
  if (local_868[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_820);
    if ((undefined8 *)local_868._8_8_ == (undefined8 *)0x0) {
      message = "";
    }
    else {
      message = *(char **)local_868._8_8_;
    }
    pcVar3 = (char *)0x772;
    testing::internal::AssertHelper::AssertHelper
              (local_848,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x772,message);
    testing::internal::AssertHelper::operator=(local_848,(Message *)&local_820);
    testing::internal::AssertHelper::~AssertHelper(local_848);
    if ((long *)local_820._M_dataplus._M_p != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_820._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_820._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_868 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_848[0].data_ = (AssertHelperData *)&DAT_0000002a;
  local_820._M_dataplus._M_p._0_4_ = 0xffffffff;
  local_820._M_string_length = 0x241ea6;
  local_820.field_2._M_allocated_capacity = 2;
  local_820.field_2._8_8_ = (ulong)(uint)local_820.field_2._12_4_ << 0x20;
  local_800[0] = fmt::v5::internal::
                 parse_format_specs<int,fmt::v5::basic_parse_context<char,fmt::v5::internal::error_handler>>
  ;
  format_str.size_ = (size_t)&local_820;
  format_str.data_ = (char *)0x2;
  fmt::v5::internal::
  parse_format_string<true,char,fmt::v5::internal::format_string_checker<char,fmt::v5::internal::error_handler,int>&>
            ((internal *)0x241ea6,format_str,
             (format_string_checker<char,_fmt::v5::internal::error_handler,_int> *)pcVar3);
  local_820.field_2._M_allocated_capacity = 0;
  local_820._M_dataplus._M_p = (pointer)&PTR_grow_002a3c18;
  local_820.field_2._8_8_ = 500;
  format_str_00.size_ = 2;
  format_str_00.data_ = "{}";
  args.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)local_848;
  args.types_ = fmt::v5::
                format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int>
                ::TYPES;
  local_820._M_string_length = (size_type)local_800;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_820,format_str_00,args,(locale_ref)0x0);
  pAVar1 = (AssertHelperData *)(local_868 + 0x10);
  local_868._0_8_ = pAVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_868,local_820._M_string_length,
             local_820.field_2._M_allocated_capacity + local_820._M_string_length);
  local_820._M_dataplus._M_p = (pointer)&PTR_grow_002a3c18;
  if ((code **)local_820._M_string_length != local_800) {
    operator_delete((void *)local_820._M_string_length);
  }
  handler = (format_string_checker<wchar_t,_fmt::v5::internal::error_handler,_int> *)0x242e5f;
  testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
            ((internal *)local_830,"\"42\"",
             "fmt::format([] { typedef typename std::remove_cv<std::remove_pointer< typename std::decay<decltype(\"{}\")>::type>::type>::type ct; struct str : fmt::compile_string { typedef ct char_type; inline operator fmt::basic_string_view<ct>() const { return {\"{}\", sizeof(\"{}\") / sizeof(ct) - 1}; } }; return str{}; }(), 42)"
             ,(char (*) [3])0x242e5f,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_868);
  if ((AssertHelperData *)local_868._0_8_ != pAVar1) {
    operator_delete((void *)local_868._0_8_);
  }
  if (local_830[0] ==
      (udl_formatter<char,(char)123,(char)48,(char)58,(char)49,(char)48,(char)125>)0x0) {
    testing::Message::Message((Message *)&local_820);
    if (local_828 == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (char *)*local_828;
    }
    handler = (format_string_checker<wchar_t,_fmt::v5::internal::error_handler,_int> *)0x773;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_868,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x773,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_868,(Message *)&local_820);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_868);
    if ((undefined **)local_820._M_dataplus._M_p != (undefined **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((undefined **)local_820._M_dataplus._M_p != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_820._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_830 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_848[0].data_ = (AssertHelperData *)&DAT_0000002a;
  local_820._M_dataplus._M_p._0_4_ = 0xffffffff;
  local_820._M_string_length = 0x245b4c;
  local_820.field_2._M_allocated_capacity = 2;
  local_820.field_2._8_8_ = local_820.field_2._8_8_ & 0xffffffff00000000;
  local_800[0] = fmt::v5::internal::
                 parse_format_specs<int,fmt::v5::basic_parse_context<wchar_t,fmt::v5::internal::error_handler>>
  ;
  format_str_01.size_ = (size_t)&local_820;
  format_str_01.data_ = (wchar_t *)0x2;
  fmt::v5::internal::
  parse_format_string<true,wchar_t,fmt::v5::internal::format_string_checker<wchar_t,fmt::v5::internal::error_handler,int>&>
            ((internal *)0x245b4c,format_str_01,handler);
  local_820.field_2._M_allocated_capacity = 0;
  local_820._M_dataplus._M_p = (pointer)&PTR_grow_002a3d40;
  local_820.field_2._8_8_ = 500;
  format_str_02.size_ = 2;
  format_str_02.data_ = L"{}";
  args_00.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
        *)local_848;
  args_00.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>,int>
       ::TYPES;
  local_820._M_string_length = (size_type)local_800;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>,wchar_t,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
            ((range)&local_820,format_str_02,args_00,(locale_ref)0x0);
  local_868._0_8_ = pAVar1;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)local_868,local_820._M_string_length,
             local_820._M_string_length + local_820.field_2._M_allocated_capacity * 4);
  local_820._M_dataplus._M_p = (pointer)&PTR_grow_002a3d40;
  if ((code **)local_820._M_string_length != local_800) {
    operator_delete((void *)local_820._M_string_length);
  }
  testing::internal::CmpHelperEQ<wchar_t[3],std::__cxx11::wstring>
            ((internal *)local_830,"L\"42\"",
             "fmt::format([] { typedef typename std::remove_cv<std::remove_pointer< typename std::decay<decltype(L\"{}\")>::type>::type>::type ct; struct str : fmt::compile_string { typedef ct char_type; inline operator fmt::basic_string_view<ct>() const { return {L\"{}\", sizeof(L\"{}\") / sizeof(ct) - 1}; } }; return str{}; }(), 42)"
             ,(wchar_t (*) [3])L"42",
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_868
            );
  if ((AssertHelperData *)local_868._0_8_ != pAVar1) {
    operator_delete((void *)local_868._0_8_);
  }
  if (local_830[0] ==
      (udl_formatter<char,(char)123,(char)48,(char)58,(char)49,(char)48,(char)125>)0x0) {
    testing::Message::Message((Message *)&local_820);
    if (local_828 == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (char *)*local_828;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_868,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x774,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_868,(Message *)&local_820);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_868);
    if ((undefined **)local_820._M_dataplus._M_p != (undefined **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((undefined **)local_820._M_dataplus._M_p != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_820._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_830 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  return;
}

Assistant:

TEST(FormatTest, UdlTemplate) {
  EXPECT_EQ("foo", "foo"_format());
  EXPECT_EQ("        42", "{0:10}"_format(42));
  EXPECT_EQ("42", fmt::format(FMT_STRING("{}"), 42));
  EXPECT_EQ(L"42", fmt::format(FMT_STRING(L"{}"), 42));
}